

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZEqnArray<long_double>,_10>::~TPZManVector
          (TPZManVector<TPZEqnArray<long_double>,_10> *this)

{
  undefined8 *in_RDI;
  TPZVec<TPZEqnArray<long_double>_> *unaff_retaddr;
  TPZEqnArray<long_double> *this_00;
  TPZEqnArray<long_double> *local_18;
  
  *in_RDI = &PTR__TPZManVector_025509e8;
  if ((undefined8 *)in_RDI[1] == in_RDI + 4) {
    in_RDI[1] = 0;
  }
  in_RDI[3] = 0;
  this_00 = (TPZEqnArray<long_double> *)(in_RDI + 4);
  local_18 = (TPZEqnArray<long_double> *)(in_RDI + 0x665c);
  do {
    local_18 = local_18 + -1;
    TPZEqnArray<long_double>::~TPZEqnArray(this_00);
  } while (local_18 != this_00);
  TPZVec<TPZEqnArray<long_double>_>::~TPZVec(unaff_retaddr);
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::~TPZManVector() {
    if (this->fStore == fExtAlloc) {
        this->fStore = nullptr;
    }
    this->fNAlloc = 0;
}